

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v7::detail::fallback_format<double>(double d,buffer<char> *buf,int *exp10)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  bigint *lhs2;
  uint64_t value;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  bool bVar10;
  bigint numerator;
  bigint denominator;
  bigint lower;
  bigint upper_store;
  bigint *local_320;
  ulong local_318;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00129d30;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00129d30;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00129d30;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  local_320 = &local_e0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00129d30;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  uVar5 = (ulong)d & 0xfffffffffffff;
  uVar9 = (uint)((ulong)d >> 0x34) & 0x7ff;
  if (uVar9 == 0) {
    value = uVar5 * 2;
    iVar4 = -0x432;
    iVar8 = 1;
    bVar10 = false;
    local_318 = uVar5;
LAB_00112eef:
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_2f0,-*exp10);
      bigint::assign(&local_190,&local_2f0);
      if (bVar10) {
        local_320 = &local_e0;
        bigint::assign(local_320,&local_2f0);
        bigint::operator<<=(&local_e0,1);
      }
      else {
        local_320 = (bigint *)0x0;
      }
      bigint::operator*=(&local_2f0,value);
      bigint::assign(&local_240,1);
      bigint::operator<<=(&local_240,iVar8 - iVar4);
    }
    else {
      bigint::assign(&local_2f0,value);
      bigint::assign_pow10(&local_240,*exp10);
      bigint::operator<<=(&local_240,iVar8 - iVar4);
      bigint::assign(&local_190,1);
      if (bVar10) {
        bigint::assign(&local_e0,2);
      }
      else {
        local_320 = (bigint *)0x0;
      }
    }
  }
  else {
    local_318 = uVar5 + 0x10000000000000;
    iVar4 = uVar9 - 0x433;
    bVar10 = uVar9 != 1 && uVar5 == 0;
    iVar8 = bVar10 + 1;
    value = local_318 << (sbyte)iVar8;
    if (uVar9 < 0x433) goto LAB_00112eef;
    bigint::assign(&local_2f0,value);
    bigint::operator<<=(&local_2f0,iVar4);
    bigint::assign(&local_190,1);
    bigint::operator<<=(&local_190,iVar4);
    if (uVar9 != 1 && uVar5 == 0) {
      local_320 = &local_e0;
      bigint::assign(local_320,1);
      bigint::operator<<=(&local_e0,uVar9 - 0x432);
    }
    else {
      local_320 = (bigint *)0x0;
    }
    bigint::assign_pow10(&local_240,*exp10);
    bigint::operator<<=(&local_240,1);
  }
  lhs2 = local_320;
  if (local_320 == (bigint *)0x0) {
    lhs2 = &local_190;
  }
  pcVar1 = buf->ptr_;
  uVar9 = ~(uint)local_318 & 1;
  lVar7 = 0;
  while( true ) {
    uVar3 = bigint::divmod_assign(&local_2f0,&local_240);
    iVar4 = compare(&local_2f0,&local_190);
    iVar8 = add_compare(&local_2f0,lhs2,&local_240);
    pcVar1[lVar7] = (char)uVar3 + '0';
    if ((iVar4 < (int)uVar9) || ((int)-uVar9 < iVar8)) break;
    bigint::multiply(&local_2f0,10);
    bigint::multiply(&local_190,10);
    if (local_320 != (bigint *)0x0) {
      bigint::multiply(local_320,10);
    }
    lVar7 = lVar7 + 1;
  }
  if (iVar4 < (int)uVar9) {
    if (iVar8 <= (int)-uVar9) goto LAB_0011313a;
    iVar4 = add_compare(&local_2f0,&local_2f0,&local_240);
    if ((iVar4 < 1) && ((uVar3 & 1) == 0 || iVar4 != 0)) goto LAB_0011313a;
    cVar2 = pcVar1[lVar7] + '\x01';
  }
  else {
    cVar2 = (char)uVar3 + '1';
  }
  pcVar1[lVar7] = cVar2;
LAB_0011313a:
  uVar6 = lVar7 + 1U & 0xffffffff;
  uVar5 = buf->capacity_;
  if (uVar5 < uVar6) {
    (**buf->_vptr_buffer)(buf,uVar6);
    uVar5 = buf->capacity_;
  }
  if (uVar5 < uVar6) {
    uVar6 = uVar5;
  }
  buf->size_ = uVar6;
  *exp10 = *exp10 - (int)lVar7;
  bigint::~bigint(&local_e0);
  bigint::~bigint(&local_190);
  bigint::~bigint(&local_240);
  bigint::~bigint(&local_2f0);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.try_resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}